

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL> *this
          ,TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  TestError *this_00;
  long *plVar3;
  size_type *psVar4;
  string shader_variable_declarations;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string shader_source;
  string input [15];
  
  shader_variable_declarations._M_dataplus._M_p = (pointer)&shader_variable_declarations.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shader_variable_declarations,
             "= float[2][1][2][1](\n        float[1][2][1](\n            float[2][1]( \n                float[1](12.3), float[1](54.2) \n            )\n        ),\n        float[1][2][1](\n            float[2][1]( \n                float[1]( 3.2), float[1]( 7.4) \n            )\n        )\n    );\n\n"
             ,"");
  input[0]._M_dataplus._M_p = (pointer)&input[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)input,"float a[2][1][2][]","");
  input[1]._M_dataplus._M_p = (pointer)&input[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 1),"float a[2][1][][1]","");
  input[2]._M_dataplus._M_p = (pointer)&input[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 2),"float a[2][1][][]","");
  input[3]._M_dataplus._M_p = (pointer)&input[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 3),"float a[2][][2][1]","");
  input[4]._M_dataplus._M_p = (pointer)&input[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 4),"float a[2][][2][]","");
  input[5]._M_dataplus._M_p = (pointer)&input[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 5),"float a[2][][][1]","");
  input[6]._M_dataplus._M_p = (pointer)&input[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 6),"float a[2][][][]","");
  input[7]._M_dataplus._M_p = (pointer)&input[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 7),"float a[][1][2][1]","");
  input[8]._M_dataplus._M_p = (pointer)&input[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 8),"float a[][1][2][]","");
  input[9]._M_dataplus._M_p = (pointer)&input[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 9),"float a[][1][][1]","");
  input[10]._M_dataplus._M_p = (pointer)&input[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 10),"float a[][1][][]","");
  input[0xb]._M_dataplus._M_p = (pointer)&input[0xb].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xb),"float a[][][2][1]","");
  input[0xc]._M_dataplus._M_p = (pointer)&input[0xc].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xc),"float a[][][2][]","");
  input[0xd]._M_dataplus._M_p = (pointer)&input[0xd].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xd),"float a[][][][1]","");
  input[0xe]._M_dataplus._M_p = (pointer)&input[0xe].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xe),"float a[][][][]","");
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,shader_start_abi_cxx11_,DAT_021e0558 + shader_start_abi_cxx11_);
  std::__cxx11::string::append((char *)&__str);
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&__str,(ulong)input[0]._M_dataplus._M_p);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_270 = *plVar3;
    lStack_268 = plVar1[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar3;
    local_280 = (long *)*plVar1;
  }
  local_278 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_280,
                              (ulong)shader_variable_declarations._M_dataplus._M_p);
  psVar4 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar4) {
    shader_source.field_2._M_allocated_capacity = *psVar4;
    shader_source.field_2._8_8_ = plVar1[3];
    shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  }
  else {
    shader_source.field_2._M_allocated_capacity = *psVar4;
    shader_source._M_dataplus._M_p = (pointer)*plVar1;
  }
  shader_source._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if (tested_shader_type < SHADER_TYPE_LAST) {
    puVar2 = &set_tesseation_abi_cxx11_;
    switch((ulong)tested_shader_type) {
    case 1:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case 3:
      puVar2 = &emit_quad_abi_cxx11_;
    case 4:
      std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
    }
    std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
    (*(code *)(&DAT_01aca48c + *(int *)(&DAT_01aca48c + (ulong)tested_shader_type * 4)))
              (&DAT_01aca48c + *(int *)(&DAT_01aca48c + (ulong)tested_shader_type * 4),
               empty_string_abi_cxx11_,empty_string_abi_cxx11_,empty_string_abi_cxx11_,
               empty_string_abi_cxx11_,empty_string_abi_cxx11_);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Unrecognized shader type.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x847);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_variable_declarations = "= float[2][1][2][1](\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1](12.3), float[1](54.2) \n"
											   "            )\n"
											   "        ),\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1]( 3.2), float[1]( 7.4) \n"
											   "            )\n"
											   "        )\n"
											   "    );\n\n";

	std::string input[] = { "float a[2][1][2][]", "float a[2][1][][1]", "float a[2][1][][]", "float a[2][][2][1]",
							"float a[2][][2][]",  "float a[2][][][1]",  "float a[2][][][]",  "float a[][1][2][1]",
							"float a[][1][2][]",  "float a[][1][][1]",  "float a[][1][][]",  "float a[][][2][1]",
							"float a[][][2][]",   "float a[][][][1]",   "float a[][][][]" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source = shader_start + "    " + input[string_index] + shader_variable_declarations;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}